

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_subset_seq_parameter_set_rbsp(sps_subset_t *sps_subset,bs_t *b)

{
  _Bool _Var1;
  sps_svc_ext_t *sps_svc_ext;
  byte *pbVar2;
  int iVar3;
  
  write_seq_parameter_set_rbsp(sps_subset->sps,b);
  iVar3 = sps_subset->sps->profile_idc;
  if ((iVar3 == 0x56) || (iVar3 == 0x53)) {
    write_seq_parameter_set_svc_extension(sps_subset,b);
    sps_svc_ext = (sps_subset->field_1).sps_svc_ext;
    _Var1 = sps_svc_ext->svc_vui_parameters_present_flag;
    iVar3 = b->bits_left + -1;
    b->bits_left = iVar3;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if (sps_svc_ext->svc_vui_parameters_present_flag == true) {
      write_svc_vui_parameters_extension(sps_svc_ext,b);
    }
  }
  _Var1 = sps_subset->additional_extension2_flag;
  iVar3 = b->bits_left + -1;
  b->bits_left = iVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  if (sps_subset->additional_extension2_flag == true) {
    while( true ) {
      iVar3 = more_rbsp_data(b);
      if (iVar3 == 0) break;
      _Var1 = sps_subset->additional_extension2_flag;
      iVar3 = b->bits_left + -1;
      b->bits_left = iVar3;
      pbVar2 = b->p;
      if (pbVar2 < b->end) {
        *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
        *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
    }
  }
  return;
}

Assistant:

void write_subset_seq_parameter_set_rbsp(sps_subset_t* sps_subset, bs_t* b)
{
    write_seq_parameter_set_rbsp(sps_subset->sps, b);
    
    switch( sps_subset->sps->profile_idc )
    {
        case 83:
        case 86:
            write_seq_parameter_set_svc_extension(sps_subset, b); /* specified in Annex G */
            
            sps_svc_ext_t* sps_svc_ext = sps_subset->sps_svc_ext;
            bs_write_u1(b, sps_svc_ext->svc_vui_parameters_present_flag);
            
            if( sps_svc_ext->svc_vui_parameters_present_flag )
            {
                write_svc_vui_parameters_extension(sps_svc_ext,b); /* specified in Annex G */
            }
            break;
        default:
            break;
    }
    bs_write_u1(b, sps_subset->additional_extension2_flag);
    if( sps_subset->additional_extension2_flag )
    {
        while( more_rbsp_data( b ) )
        {
            bs_write_u1(b, sps_subset->additional_extension2_flag);
        }
    }
    
}